

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

int translate_code(lemon *lemp,rule *rp)

{
  byte bVar1;
  char *__s1;
  ushort *puVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  byte *pbVar7;
  ushort **ppuVar8;
  size_t sVar9;
  symbol *psVar10;
  ulong uVar11;
  char *pcVar12;
  char **ppcVar13;
  long lVar14;
  long lVar15;
  int n;
  byte *pbVar16;
  byte *__s1_00;
  bool bVar17;
  bool bVar18;
  char zLhs [50];
  char used [1000];
  char zOvwrt [900];
  int local_810;
  char local_7e8 [64];
  char local_7a8 [1008];
  char local_3b8 [904];
  
  iVar4 = rp->nrhs;
  if (0 < (long)iVar4) {
    memset(local_7a8,0,(long)iVar4);
  }
  bVar17 = rp->code == (char *)0x0;
  if (bVar17) {
    rp->code = translate_code::newlinestr;
    rp->line = rp->ruleline;
  }
  rp->noCode = (uint)bVar17;
  if (iVar4 == 0) {
LAB_0010b529:
    bVar17 = false;
LAB_0010b52c:
    pbVar7 = (byte *)0x0;
LAB_0010b52f:
    local_810 = 0;
    sprintf(local_7e8,"yymsp[%d].minor.yy%d",(ulong)(1 - rp->nrhs),(ulong)(uint)rp->lhs->dtnum);
    bVar3 = false;
  }
  else {
    pcVar12 = *rp->rhsalias;
    if (pcVar12 == (char *)0x0) {
      psVar10 = *rp->rhs;
      if (psVar10->type == TERMINAL) {
        ppcVar13 = &lemp->tokendest;
LAB_0010b481:
        if (*ppcVar13 == (char *)0x0) goto LAB_0010b529;
      }
      else if (lemp->vardest == (char *)0x0) {
        ppcVar13 = &psVar10->destructor;
        goto LAB_0010b481;
      }
      if (append_str::z != (char *)0x0 && append_str::used == 0) {
        *append_str::z = '\0';
        psVar10 = *rp->rhs;
        iVar4 = rp->nrhs;
      }
      append_str::used = 0;
      bVar17 = false;
      append_str("  yy_destructor(yypParser,%d,&yymsp[%d].minor);\n",0,psVar10->index,1 - iVar4);
      pcVar12 = append_str::z;
      if (append_str::z != (char *)0x0 && append_str::used == 0) {
        *append_str::z = '\0';
      }
      append_str::used = 0;
      pcVar12 = Strsafe(pcVar12);
      rp->codePrefix = pcVar12;
      rp->noCode = LEMON_FALSE;
      goto LAB_0010b52c;
    }
    __s1 = rp->lhsalias;
    if (__s1 == (char *)0x0) goto LAB_0010b529;
    iVar4 = strcmp(__s1,pcVar12);
    if (iVar4 == 0) {
      local_7a8[0] = '\x01';
      bVar17 = true;
      if (rp->lhs->dtnum != (*rp->rhs)->dtnum) {
        pbVar7 = (byte *)0x0;
        ErrorMsg(lemp->filename,rp->ruleline,
                 "%s(%s) and %s(%s) share the same label but have different datatypes.",
                 rp->lhs->name,__s1,(*rp->rhs)->name,pcVar12);
        lemp->errorcnt = lemp->errorcnt + 1;
        bVar17 = true;
        goto LAB_0010b52f;
      }
      goto LAB_0010b52c;
    }
    bVar17 = false;
    lemon_sprintf(local_3b8,"/*%s-overwrites-%s*/",__s1,pcVar12);
    pbVar7 = (byte *)strstr(rp->code,local_3b8);
    if (pbVar7 != (byte *)0x0) goto LAB_0010b52f;
    bVar17 = false;
    sprintf(local_7e8,"yylhsminor.yy%d",(ulong)(uint)rp->lhs->dtnum);
    local_810 = 1;
    bVar3 = true;
    pbVar7 = (byte *)0x0;
  }
  pcVar12 = append_str::z;
  if (append_str::z != (char *)0x0 && append_str::used == 0) {
    *append_str::z = '\0';
  }
  append_str::used = 0;
  __s1_00 = (byte *)rp->code;
  bVar1 = *__s1_00;
  if (bVar1 == 0) {
    bVar18 = true;
  }
  else {
    bVar18 = false;
    do {
      if (__s1_00 == pbVar7) {
        append_str(local_3b8,0,0,0);
        sVar9 = strlen(local_3b8);
        __s1_00 = __s1_00 + ((int)sVar9 + -1);
        bVar18 = true;
      }
      else {
        ppuVar8 = __ctype_b_loc();
        puVar2 = *ppuVar8;
        if (((*(byte *)((long)puVar2 + (ulong)bVar1 * 2 + 1) & 4) != 0) &&
           ((pbVar16 = __s1_00, __s1_00 == (byte *)rp->code ||
            ((__s1_00[-1] != 0x5f && ((puVar2[__s1_00[-1]] & 8) == 0)))))) {
          do {
            do {
              bVar1 = pbVar16[1];
              pbVar16 = pbVar16 + 1;
            } while (bVar1 == 0x5f);
          } while ((puVar2[bVar1] & 8) != 0);
          *pbVar16 = 0;
          if ((rp->lhsalias == (char *)0x0) ||
             (iVar4 = strcmp((char *)__s1_00,rp->lhsalias), iVar4 != 0)) {
            iVar4 = rp->nrhs;
            if (0 < (long)iVar4) {
              ppcVar13 = rp->rhsalias;
              lVar15 = 0;
              do {
                pcVar12 = ppcVar13[lVar15];
                if ((pcVar12 != (char *)0x0) &&
                   (iVar5 = strcmp((char *)__s1_00,pcVar12), iVar5 == 0)) {
                  if (bVar18 && lVar15 == 0) {
                    ErrorMsg(lemp->filename,rp->ruleline,"Label %s used after \'%s\'.",*ppcVar13,
                             local_3b8);
                    lemp->errorcnt = lemp->errorcnt + 1;
                  }
                  else {
                    if ((__s1_00 == (byte *)rp->code) || (__s1_00[-1] != 0x40)) {
                      psVar10 = rp->rhs[lVar15];
                      if (psVar10->type == MULTITERMINAL) {
                        psVar10 = *psVar10->subsym;
                      }
                      iVar5 = psVar10->dtnum;
                      pcVar12 = "yymsp[%d].minor.yy%d";
                      n = 0;
                    }
                    else {
                      pcVar12 = "yymsp[%d].major";
                      n = -1;
                      iVar5 = 0;
                    }
                    append_str(pcVar12,n,((int)lVar15 - iVar4) + 1,iVar5);
                  }
                  local_7a8[lVar15] = '\x01';
                  __s1_00 = pbVar16;
                  break;
                }
                lVar15 = lVar15 + 1;
              } while (iVar4 != lVar15);
            }
          }
          else {
            append_str(local_7e8,0,0,0);
            bVar17 = true;
            __s1_00 = pbVar16;
          }
          *pbVar16 = bVar1;
        }
        append_str((char *)__s1_00,1,0,0);
      }
      bVar1 = __s1_00[1];
      __s1_00 = __s1_00 + 1;
    } while (bVar1 != 0);
    bVar18 = append_str::used == 0;
    pcVar12 = append_str::z;
  }
  if ((bool)(pcVar12 != (char *)0x0 & bVar18)) {
    *pcVar12 = '\0';
LAB_0010b7ad:
    bVar18 = true;
  }
  else {
    append_str::used = 0;
    if (pcVar12 == (char *)0x0) goto LAB_0010b7ef;
    if (*pcVar12 == '\0') goto LAB_0010b7ad;
    pcVar12 = Strsafe(pcVar12);
    rp->code = pcVar12;
    bVar18 = append_str::used == 0;
    pcVar12 = append_str::z;
  }
  if ((bool)(pcVar12 != (char *)0x0 & bVar18)) {
    *pcVar12 = '\0';
  }
LAB_0010b7ef:
  append_str::used = 0;
  if (!bVar17 && rp->lhsalias != (char *)0x0) {
    translate_code_cold_1();
  }
  uVar6 = rp->nrhs;
  uVar11 = (ulong)uVar6;
  if (0 < (int)uVar6) {
    lVar15 = 0;
    do {
      ppcVar13 = rp->rhsalias;
      pcVar12 = ppcVar13[lVar15];
      if (pcVar12 == (char *)0x0) {
        if (lVar15 != 0) {
          psVar10 = rp->rhs[lVar15];
          ppcVar13 = &lemp->tokendest;
          if (psVar10->type == TERMINAL) {
LAB_0010b907:
            if (*ppcVar13 == (char *)0x0) goto LAB_0010b925;
          }
          else if (lemp->vardest == (char *)0x0) {
            ppcVar13 = &psVar10->destructor;
            goto LAB_0010b907;
          }
          append_str("  yy_destructor(yypParser,%d,&yymsp[%d].minor);\n",0,psVar10->index,
                     ((int)lVar15 - (int)uVar11) + 1);
        }
      }
      else {
        if (lVar15 != 0) {
          if ((rp->lhsalias != (char *)0x0) && (iVar4 = strcmp(rp->lhsalias,pcVar12), iVar4 == 0)) {
            ErrorMsg(lemp->filename,rp->ruleline,
                     "%s(%s) has the same label as the LHS but is not the left-most symbol on the RHS."
                     ,rp->rhs[lVar15]->name,pcVar12);
            lemp->errorcnt = lemp->errorcnt + 1;
            ppcVar13 = rp->rhsalias;
          }
          lVar14 = 0;
          do {
            if (ppcVar13[lVar14] != (char *)0x0) {
              pcVar12 = ppcVar13[lVar15];
              iVar4 = strcmp(ppcVar13[lVar14],pcVar12);
              if (iVar4 == 0) {
                ErrorMsg(lemp->filename,rp->ruleline,
                         "Label %s used for multiple symbols on the RHS of a rule.",pcVar12);
                lemp->errorcnt = lemp->errorcnt + 1;
                break;
              }
            }
            lVar14 = lVar14 + 1;
          } while (lVar15 + (ulong)(lVar15 == 0) != lVar14);
        }
        if (local_7a8[lVar15] == '\0') {
          ErrorMsg(lemp->filename,rp->ruleline,"Label %s for \"%s(%s)\" is never used.",
                   rp->rhsalias[lVar15],rp->rhs[lVar15]->name,rp->rhsalias[lVar15]);
          lemp->errorcnt = lemp->errorcnt + 1;
        }
      }
LAB_0010b925:
      lVar15 = lVar15 + 1;
      uVar6 = rp->nrhs;
      uVar11 = (ulong)(int)uVar6;
    } while (lVar15 < (long)uVar11);
  }
  if (bVar3) {
    append_str("  yymsp[%d].minor.yy%d = ",0,1 - uVar6,rp->lhs->dtnum);
    append_str(local_7e8,0,0,0);
    append_str(";\n",0,0,0);
  }
  if (append_str::z == (char *)0x0 || append_str::used != 0) {
    append_str::used = 0;
    if ((append_str::z != (char *)0x0) && (*append_str::z != '\0')) {
      pcVar12 = Strsafe(append_str::z);
      rp->codeSuffix = pcVar12;
      rp->noCode = LEMON_FALSE;
    }
  }
  else {
    *append_str::z = '\0';
    append_str::used = 0;
  }
  return local_810;
}

Assistant:

PRIVATE int translate_code(struct lemon *lemp, struct rule *rp){
  char *cp, *xp;
  int i;
  int rc = 0;            /* True if yylhsminor is used */
  int dontUseRhs0 = 0;   /* If true, use of left-most RHS label is illegal */
  const char *zSkip = 0; /* The zOvwrt comment within rp->code, or NULL */
  char lhsused = 0;      /* True if the LHS element has been used */
  char lhsdirect;        /* True if LHS writes directly into stack */
  char used[MAXRHS];     /* True for each RHS element which is used */
  char zLhs[50];         /* Convert the LHS symbol into this string */
  char zOvwrt[900];      /* Comment that to allow LHS to overwrite RHS */

  for(i=0; i<rp->nrhs; i++) used[i] = 0;
  lhsused = 0;

  if( rp->code==0 ){
    static char newlinestr[2] = { '\n', '\0' };
    rp->code = newlinestr;
    rp->line = rp->ruleline;
    rp->noCode = 1;
  }else{
    rp->noCode = 0;
  }


  if( rp->nrhs==0 ){
    /* If there are no RHS symbols, then writing directly to the LHS is ok */
    lhsdirect = 1;
  }else if( rp->rhsalias[0]==0 ){
    /* The left-most RHS symbol has no value.  LHS direct is ok.  But
    ** we have to call the distructor on the RHS symbol first. */
    lhsdirect = 1;
    if( has_destructor(rp->rhs[0],lemp) ){
      append_str(0,0,0,0);
      append_str("  yy_destructor(yypParser,%d,&yymsp[%d].minor);\n", 0,
                 rp->rhs[0]->index,1-rp->nrhs);
      rp->codePrefix = Strsafe(append_str(0,0,0,0));
      rp->noCode = 0;
    }
  }else if( rp->lhsalias==0 ){
    /* There is no LHS value symbol. */
    lhsdirect = 1;
  }else if( strcmp(rp->lhsalias,rp->rhsalias[0])==0 ){
    /* The LHS symbol and the left-most RHS symbol are the same, so
    ** direct writing is allowed */
    lhsdirect = 1;
    lhsused = 1;
    used[0] = 1;
    if( rp->lhs->dtnum!=rp->rhs[0]->dtnum ){
      ErrorMsg(lemp->filename,rp->ruleline,
        "%s(%s) and %s(%s) share the same label but have "
        "different datatypes.",
        rp->lhs->name, rp->lhsalias, rp->rhs[0]->name, rp->rhsalias[0]);
      lemp->errorcnt++;
    }
  }else{
    lemon_sprintf(zOvwrt, "/*%s-overwrites-%s*/",
                  rp->lhsalias, rp->rhsalias[0]);
    zSkip = strstr(rp->code, zOvwrt);
    if( zSkip!=0 ){
      /* The code contains a special comment that indicates that it is safe
      ** for the LHS label to overwrite left-most RHS label. */
      lhsdirect = 1;
    }else{
      lhsdirect = 0;
    }
  }
  if( lhsdirect ){
    sprintf(zLhs, "yymsp[%d].minor.yy%d",1-rp->nrhs,rp->lhs->dtnum);
  }else{
    rc = 1;
    sprintf(zLhs, "yylhsminor.yy%d",rp->lhs->dtnum);
  }

  append_str(0,0,0,0);

  /* This const cast is wrong but harmless, if we're careful. */
  for(cp=(char *)rp->code; *cp; cp++){
    if( cp==zSkip ){
      append_str(zOvwrt,0,0,0);
      cp += lemonStrlen(zOvwrt)-1;
      dontUseRhs0 = 1;
      continue;
    }
    if( ISALPHA(*cp) && (cp==rp->code || (!ISALNUM(cp[-1]) && cp[-1]!='_')) ){
      char saved;
      for(xp= &cp[1]; ISALNUM(*xp) || *xp=='_'; xp++);
      saved = *xp;
      *xp = 0;
      if( rp->lhsalias && strcmp(cp,rp->lhsalias)==0 ){
        append_str(zLhs,0,0,0);
        cp = xp;
        lhsused = 1;
      }else{
        for(i=0; i<rp->nrhs; i++){
          if( rp->rhsalias[i] && strcmp(cp,rp->rhsalias[i])==0 ){
            if( i==0 && dontUseRhs0 ){
              ErrorMsg(lemp->filename,rp->ruleline,
                 "Label %s used after '%s'.",
                 rp->rhsalias[0], zOvwrt);
              lemp->errorcnt++;
            }else if( cp!=rp->code && cp[-1]=='@' ){
              /* If the argument is of the form @X then substituted
              ** the token number of X, not the value of X */
              append_str("yymsp[%d].major",-1,i-rp->nrhs+1,0);
            }else{
              struct symbol *sp = rp->rhs[i];
              int dtnum;
              if( sp->type==MULTITERMINAL ){
                dtnum = sp->subsym[0]->dtnum;
              }else{
                dtnum = sp->dtnum;
              }
              append_str("yymsp[%d].minor.yy%d",0,i-rp->nrhs+1, dtnum);
            }
            cp = xp;
            used[i] = 1;
            break;
          }
        }
      }
      *xp = saved;
    }
    append_str(cp, 1, 0, 0);
  } /* End loop */

  /* Main code generation completed */
  cp = append_str(0,0,0,0);
  if( cp && cp[0] ) rp->code = Strsafe(cp);
  append_str(0,0,0,0);

  /* Check to make sure the LHS has been used */
  if( rp->lhsalias && !lhsused ){
    ErrorMsg(lemp->filename,rp->ruleline,
      "Label \"%s\" for \"%s(%s)\" is never used.",
        rp->lhsalias,rp->lhs->name,rp->lhsalias);
    lemp->errorcnt++;
  }

  /* Generate destructor code for RHS minor values which are not referenced.
  ** Generate error messages for unused labels and duplicate labels.
  */
  for(i=0; i<rp->nrhs; i++){
    if( rp->rhsalias[i] ){
      if( i>0 ){
        int j;
        if( rp->lhsalias && strcmp(rp->lhsalias,rp->rhsalias[i])==0 ){
          ErrorMsg(lemp->filename,rp->ruleline,
            "%s(%s) has the same label as the LHS but is not the left-most "
            "symbol on the RHS.",
            rp->rhs[i]->name, rp->rhsalias[i]);
          lemp->errorcnt++;
        }
        for(j=0; j<i; j++){
          if( rp->rhsalias[j] && strcmp(rp->rhsalias[j],rp->rhsalias[i])==0 ){
            ErrorMsg(lemp->filename,rp->ruleline,
              "Label %s used for multiple symbols on the RHS of a rule.",
              rp->rhsalias[i]);
            lemp->errorcnt++;
            break;
          }
        }
      }
      if( !used[i] ){
        ErrorMsg(lemp->filename,rp->ruleline,
          "Label %s for \"%s(%s)\" is never used.",
          rp->rhsalias[i],rp->rhs[i]->name,rp->rhsalias[i]);
        lemp->errorcnt++;
      }
    }else if( i>0 && has_destructor(rp->rhs[i],lemp) ){
      append_str("  yy_destructor(yypParser,%d,&yymsp[%d].minor);\n", 0,
         rp->rhs[i]->index,i-rp->nrhs+1);
    }
  }

  /* If unable to write LHS values directly into the stack, write the
  ** saved LHS value now. */
  if( lhsdirect==0 ){
    append_str("  yymsp[%d].minor.yy%d = ", 0, 1-rp->nrhs, rp->lhs->dtnum);
    append_str(zLhs, 0, 0, 0);
    append_str(";\n", 0, 0, 0);
  }

  /* Suffix code generation complete */
  cp = append_str(0,0,0,0);
  if( cp && cp[0] ){
    rp->codeSuffix = Strsafe(cp);
    rp->noCode = 0;
  }

  return rc;
}